

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<spirv_cross::SPIRExtension_*,_0UL>::SmallVector
          (SmallVector<spirv_cross::SPIRExtension_*,_0UL> *this)

{
  SPIRExtension **ppSVar1;
  SmallVector<spirv_cross::SPIRExtension_*,_0UL> *this_local;
  
  VectorView<spirv_cross::SPIRExtension_*>::VectorView
            (&this->super_VectorView<spirv_cross::SPIRExtension_*>);
  this->buffer_capacity = 0;
  ppSVar1 = AlignedBuffer<spirv_cross::SPIRExtension_*,_0UL>::data
                      ((AlignedBuffer<spirv_cross::SPIRExtension_*,_0UL> *)&this->field_0x18);
  (this->super_VectorView<spirv_cross::SPIRExtension_*>).ptr = ppSVar1;
  this->buffer_capacity = 0;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}